

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int writeMasterJournal(Pager *pPager,char *zMaster)

{
  i64 iVar1;
  u32 local_3c;
  long lStack_38;
  u32 cksum;
  i64 jrnlSize;
  i64 iHdrOff;
  int nMaster;
  int rc;
  char *zMaster_local;
  Pager *pPager_local;
  
  local_3c = 0;
  if (((zMaster == (char *)0x0) || (pPager->journalMode == '\x04')) ||
     (pPager->jfd->pMethods == (sqlite3_io_methods *)0x0)) {
    pPager_local._4_4_ = 0;
  }
  else {
    pPager->setMaster = '\x01';
    for (iHdrOff._0_4_ = 0; zMaster[(int)(u32)iHdrOff] != '\0'; iHdrOff._0_4_ = (u32)iHdrOff + 1) {
      local_3c = (int)zMaster[(int)(u32)iHdrOff] + local_3c;
    }
    _nMaster = zMaster;
    zMaster_local = (char *)pPager;
    if (pPager->fullSync != '\0') {
      iVar1 = journalHdrOffset(pPager);
      *(i64 *)(zMaster_local + 0x60) = iVar1;
    }
    jrnlSize = *(i64 *)(zMaster_local + 0x60);
    iHdrOff._4_4_ =
         write32bits(*(sqlite3_file **)(zMaster_local + 0x50),jrnlSize,
                     sqlite3PendingByte / *(int *)(zMaster_local + 0xbc) + 1);
    if (((iHdrOff._4_4_ == 0) &&
        (iHdrOff._4_4_ =
              sqlite3OsWrite(*(sqlite3_file **)(zMaster_local + 0x50),_nMaster,(u32)iHdrOff,
                             jrnlSize + 4), iHdrOff._4_4_ == 0)) &&
       ((iHdrOff._4_4_ =
              write32bits(*(sqlite3_file **)(zMaster_local + 0x50),
                          jrnlSize + 4 + (long)(int)(u32)iHdrOff,(u32)iHdrOff), iHdrOff._4_4_ == 0
        && ((iHdrOff._4_4_ =
                  write32bits(*(sqlite3_file **)(zMaster_local + 0x50),
                              jrnlSize + (int)(u32)iHdrOff + 8,local_3c), iHdrOff._4_4_ == 0 &&
            (iHdrOff._4_4_ =
                  sqlite3OsWrite(*(sqlite3_file **)(zMaster_local + 0x50),aJournalMagic,8,
                                 jrnlSize + (int)(u32)iHdrOff + 0xc), iHdrOff._4_4_ == 0)))))) {
      *(long *)(zMaster_local + 0x60) =
           (long)(int)((u32)iHdrOff + 0x14) + *(long *)(zMaster_local + 0x60);
      iHdrOff._4_4_ =
           sqlite3OsFileSize(*(sqlite3_file **)(zMaster_local + 0x50),&stack0xffffffffffffffc8);
      if ((iHdrOff._4_4_ == 0) && (*(long *)(zMaster_local + 0x60) < lStack_38)) {
        iHdrOff._4_4_ =
             sqlite3OsTruncate(*(sqlite3_file **)(zMaster_local + 0x50),
                               *(i64 *)(zMaster_local + 0x60));
      }
      return iHdrOff._4_4_;
    }
    pPager_local._4_4_ = iHdrOff._4_4_;
  }
  return pPager_local._4_4_;
}

Assistant:

static int writeMasterJournal(Pager *pPager, const char *zMaster){
  int rc;                          /* Return code */
  int nMaster;                     /* Length of string zMaster */
  i64 iHdrOff;                     /* Offset of header in journal file */
  i64 jrnlSize;                    /* Size of journal file on disk */
  u32 cksum = 0;                   /* Checksum of string zMaster */

  assert( pPager->setMaster==0 );
  assert( !pagerUseWal(pPager) );

  if( !zMaster 
   || pPager->journalMode==PAGER_JOURNALMODE_MEMORY 
   || !isOpen(pPager->jfd)
  ){
    return SQLITE_OK;
  }
  pPager->setMaster = 1;
  assert( pPager->journalHdr <= pPager->journalOff );

  /* Calculate the length in bytes and the checksum of zMaster */
  for(nMaster=0; zMaster[nMaster]; nMaster++){
    cksum += zMaster[nMaster];
  }

  /* If in full-sync mode, advance to the next disk sector before writing
  ** the master journal name. This is in case the previous page written to
  ** the journal has already been synced.
  */
  if( pPager->fullSync ){
    pPager->journalOff = journalHdrOffset(pPager);
  }
  iHdrOff = pPager->journalOff;

  /* Write the master journal data to the end of the journal file. If
  ** an error occurs, return the error code to the caller.
  */
  if( (0 != (rc = write32bits(pPager->jfd, iHdrOff, PAGER_MJ_PGNO(pPager))))
   || (0 != (rc = sqlite3OsWrite(pPager->jfd, zMaster, nMaster, iHdrOff+4)))
   || (0 != (rc = write32bits(pPager->jfd, iHdrOff+4+nMaster, nMaster)))
   || (0 != (rc = write32bits(pPager->jfd, iHdrOff+4+nMaster+4, cksum)))
   || (0 != (rc = sqlite3OsWrite(pPager->jfd, aJournalMagic, 8,
                                 iHdrOff+4+nMaster+8)))
  ){
    return rc;
  }
  pPager->journalOff += (nMaster+20);

  /* If the pager is in peristent-journal mode, then the physical 
  ** journal-file may extend past the end of the master-journal name
  ** and 8 bytes of magic data just written to the file. This is 
  ** dangerous because the code to rollback a hot-journal file
  ** will not be able to find the master-journal name to determine 
  ** whether or not the journal is hot. 
  **
  ** Easiest thing to do in this scenario is to truncate the journal 
  ** file to the required size.
  */ 
  if( SQLITE_OK==(rc = sqlite3OsFileSize(pPager->jfd, &jrnlSize))
   && jrnlSize>pPager->journalOff
  ){
    rc = sqlite3OsTruncate(pPager->jfd, pPager->journalOff);
  }
  return rc;
}